

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

void __thiscall Json::Reader::Reader(Reader *this)

{
  Features FVar1;
  long in_RDI;
  stack<Json::Value_*,_std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>_>
  *in_stack_ffffffffffffffb0;
  
  std::stack<Json::Value*,std::deque<Json::Value*,std::allocator<Json::Value*>>>::
  stack<std::deque<Json::Value*,std::allocator<Json::Value*>>,void>(in_stack_ffffffffffffffb0);
  std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::deque
            ((deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_> *)0x1e62b3);
  std::__cxx11::string::string((string *)(in_RDI + 0xa0));
  *(undefined8 *)(in_RDI + 0xc0) = 0;
  *(undefined8 *)(in_RDI + 200) = 0;
  *(undefined8 *)(in_RDI + 0xd0) = 0;
  *(undefined8 *)(in_RDI + 0xd8) = 0;
  *(undefined8 *)(in_RDI + 0xe0) = 0;
  std::__cxx11::string::string((string *)(in_RDI + 0xe8));
  FVar1 = Features::all();
  *(Features *)(in_RDI + 0x108) = FVar1;
  *(undefined1 *)(in_RDI + 0x10c) = 0;
  return;
}

Assistant:

Reader::Reader()
    :  features_(Features::all()) {}